

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotBars<unsigned_long_long>
               (char *label_id,unsigned_long_long *xs,unsigned_long_long *ys,int count,double width,
               int offset,int stride)

{
  undefined1 local_58 [8];
  GetterXsYs<unsigned_long_long> getter;
  int stride_local;
  int offset_local;
  double width_local;
  int count_local;
  unsigned_long_long *ys_local;
  unsigned_long_long *xs_local;
  char *label_id_local;
  
  getter.Stride = stride;
  getter._28_4_ = offset;
  GetterXsYs<unsigned_long_long>::GetterXsYs
            ((GetterXsYs<unsigned_long_long> *)local_58,xs,ys,count,offset,stride);
  PlotBarsEx<ImPlot::GetterXsYs<unsigned_long_long>>
            (label_id,(GetterXsYs<unsigned_long_long> *)local_58,width);
  return;
}

Assistant:

void PlotBars(const char* label_id, const T* xs, const T* ys, int count, double width, int offset, int stride) {
    GetterXsYs<T> getter(xs,ys,count,offset,stride);
    PlotBarsEx(label_id, getter, width);
}